

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

TextureFormat sglr::toNonSRGBFormat(TextureFormat *fmt)

{
  ChannelType CVar1;
  ulong uVar2;
  ulong uStack_8;
  
  if (fmt->order == sRGBA) {
    CVar1 = fmt->type;
    uStack_8 = 8;
  }
  else {
    if (fmt->order != sRGB) {
      uStack_8 = (ulong)*fmt & 0xffffffff;
      uVar2 = (ulong)*fmt >> 0x20;
      goto LAB_01525cbf;
    }
    CVar1 = fmt->type;
    uStack_8 = 7;
  }
  uVar2 = (ulong)CVar1;
LAB_01525cbf:
  return (TextureFormat)(uVar2 << 0x20 | uStack_8);
}

Assistant:

tcu::TextureFormat toNonSRGBFormat (const tcu::TextureFormat& fmt)
{
	switch (fmt.order)
	{
		case tcu::TextureFormat::sRGB:
			return tcu::TextureFormat(tcu::TextureFormat::RGB,	fmt.type);
		case tcu::TextureFormat::sRGBA:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA,	fmt.type);
		default:
			return fmt;
	}
}